

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunLegalizeArrayValues(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SynBase *pSVar1;
  TypeBase *pTVar2;
  TypeBase *type;
  VmConstant *address;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  InplaceStr *pIVar5;
  uint offset;
  VmValue *pVVar6;
  uint i;
  VmValueType index;
  VmValue *original;
  VmValue *pVVar7;
  VmBlock **ppVVar8;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 3) {
      ppVVar8 = &module->currentBlock;
      module->currentBlock = (VmBlock *)value;
      pVVar7 = (VmValue *)value[1].comment.end;
      while (original = pVVar7, original != (VmValue *)0x0) {
        pVVar7 = original[1].users.little[0];
        if (*(int *)&original[1]._vptr_VmValue == 0x4a) {
          pTVar2 = GetBaseType(ctx,original->type);
          pTVar2 = (TypeBase *)pTVar2[1]._vptr_TypeBase;
          value[1].users.data = (VmValue **)original;
          pSVar1 = original->source;
          type = GetBaseType(ctx,original->type);
          pVVar6 = (VmValue *)0x1;
          address = anon_unknown.dwarf_11cad6::CreateAlloca(ctx,module,pSVar1,type,"array",true);
          FinalizeAlloca(ctx,module,address->container);
          for (index = VM_TYPE_VOID; offset = (uint)pVVar6, index < original[1].type.type;
              index = index + VM_TYPE_INT) {
            ppVVar3 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&original[1].typeID,index);
            pVVar6 = *ppVVar3;
            if (pVVar6 == (VmValue *)0x0) {
              pVVar6 = (VmValue *)0x0;
            }
            else if ((pVVar6->typeID == 2) && (*(int *)&pVVar6[1]._vptr_VmValue == 0x11)) {
              ppVVar3 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&pVVar6[1].typeID,0);
              pVVar6 = *ppVVar3;
            }
            anon_unknown.dwarf_11cad6::CreateStore
                      (ctx,module,original->source,pTVar2,&address->super_VmValue,pVVar6,
                       (int)pTVar2->size * index);
          }
          pSVar1 = original->source;
          pTVar2 = GetBaseType(ctx,original->type);
          pVVar6 = anon_unknown.dwarf_11cad6::CreateLoad
                             (ctx,module,pSVar1,pTVar2,&address->super_VmValue,offset);
          if ((pVVar6 == (VmValue *)0x0) || (pVVar4 = pVVar6, pVVar6->typeID != 2)) {
            pVVar4 = (VmValue *)0x0;
          }
          if (pVVar4 != (VmValue *)0x0) {
            pVVar7 = pVVar4;
          }
          anon_unknown.dwarf_11cad6::ReplaceValueUsersWith(module,original,pVVar6,(uint *)0x0);
          value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
        }
      }
    }
    else {
      if (value->typeID != 4) {
        return;
      }
      ppVVar8 = (VmBlock **)&module->currentFunction;
      module->currentFunction = (VmFunction *)value;
      pIVar5 = (InplaceStr *)&value[1].source;
      while (pVVar7 = (VmValue *)pIVar5->begin, pVVar7 != (VmValue *)0x0) {
        RunLegalizeArrayValues(ctx,module,pVVar7);
        pIVar5 = &pVVar7[1].comment;
      }
    }
    *ppVVar8 = (VmBlock *)0x0;
  }
  return;
}

Assistant:

void RunLegalizeArrayValues(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeArrayValues(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_ARRAY)
			{
				TypeArray *typeArray = getType<TypeArray>(GetBaseType(ctx, curr->type));

				TypeBase *elementType = typeArray->subType;

				block->insertPoint = curr;

				VmConstant *address = CreateAlloca(ctx, module, curr->source, GetBaseType(ctx, curr->type), "array", true);

				FinalizeAlloca(ctx, module, address->container);

				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					VmValue *element = curr->arguments[i];

					if(VmInstruction *elementInst = getType<VmInstruction>(element))
					{
						if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
							element = elementInst->arguments[0];
					}

					CreateStore(ctx, module, curr->source, elementType, address, element, unsigned(elementType->size * i));
				}

				VmValue *load = CreateLoad(ctx, module, curr->source, GetBaseType(ctx, curr->type), address, 0);

				if(VmInstruction *loadInst = getType<VmInstruction>(load))
					next = loadInst;

				ReplaceValueUsersWith(module, curr, load, NULL);

				block->insertPoint = block->lastInstruction;
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}